

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O2

void __thiscall
Js::DebugManager::DebugManager
          (DebugManager *this,ThreadContext *_pThreadContext,
          AllocationPolicyManager *allocationPolicyManager)

{
  code *pcVar1;
  bool bVar2;
  HANDLE processHandle;
  undefined4 *puVar3;
  
  (this->pConsoleScope).ptr = (DynamicObject *)0x0;
  this->debugSessionNumber = 0;
  this->pCurrentInterpreterLocation = (InterpreterHaltState *)0x0;
  this->secondaryCurrentSourceContext = 0;
  this->pThreadContext = _pThreadContext;
  this->isAtDispatchHalt = false;
  processHandle = GetCurrentProcess();
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::PageAllocatorBase(&this->diagnosticPageAllocator,allocationPolicyManager,
                      (ConfigFlagsTable *)&Configuration::Global,PageAllocatorType_Diag,0,false,
                      (BackgroundPageQueue *)0x0,0x20,0,false,false,processHandle,false);
  *(undefined8 *)((long)&this->anonymousCodeRegistrationCount + 1) = 0;
  this->evalCodeRegistrationCount = 0;
  this->anonymousCodeRegistrationCount = 0;
  DebuggingFlags::DebuggingFlags(&this->debuggingFlags);
  this->nextBreakPointId = 0;
  this->localsDisplayFlags = 0;
  this->dispatchHaltFrameAddress = (void *)0x0;
  StepController::StepController(&this->stepController);
  AsyncBreakController::AsyncBreakController(&this->asyncBreakController);
  this->mutationNewValuePid = -1;
  this->mutationPropertyNamePid = -1;
  this->mutationTypePid = -1;
  if (_pThreadContext == (ThreadContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x1d,"(_pThreadContext != nullptr)","_pThreadContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->diagnosticPageAllocator).disableThreadAccessCheck = true;
  (this->diagnosticPageAllocator).debugName = L"Diagnostic";
  return;
}

Assistant:

DebugManager::DebugManager(ThreadContext* _pThreadContext, AllocationPolicyManager * allocationPolicyManager) :
        pCurrentInterpreterLocation(nullptr),
        secondaryCurrentSourceContext(0),
        debugSessionNumber(0),
        pThreadContext(_pThreadContext),
        isAtDispatchHalt(false),
        mutationNewValuePid(Js::Constants::NoProperty),
        mutationPropertyNamePid(Js::Constants::NoProperty),
        mutationTypePid(Js::Constants::NoProperty),
        diagnosticPageAllocator(allocationPolicyManager, Js::Configuration::Global.flags, PageAllocatorType_Diag, 0),
        evalCodeRegistrationCount(0),
        anonymousCodeRegistrationCount(0),
        jscriptBlockRegistrationCount(0),
        isDebuggerAttaching(false),
        nextBreakPointId(0),
        localsDisplayFlags(LocalsDisplayFlags_None),
        dispatchHaltFrameAddress(nullptr)
    {
        Assert(_pThreadContext != nullptr);
#if DBG
        // diagnosticPageAllocator may be used in multiple thread, but it's usage is synchronized.
        diagnosticPageAllocator.SetDisableThreadAccessCheck();
        diagnosticPageAllocator.debugName = _u("Diagnostic");
#endif
    }